

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

bool __thiscall Loader::writeBin(Loader *this,string *binFile,bool flash,string *loaderFile)

{
  bool bVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  char *pcVar3;
  allocator local_172;
  allocator local_171;
  duration<long,_std::ratio<1L,_1000L>_> local_170;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string binStr;
  string local_68;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000011,flash) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Programming FPGA...");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string((string *)&local_68,(string *)binFile);
    bVar1 = loadBin(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to initialize FPGA!");
      std::endl<char,std::char_traits<char>>(poVar2);
      return false;
    }
LAB_00111b66:
    bVar1 = resetState(this);
    if (!bVar1) {
      return false;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Done.");
    std::endl<char,std::char_traits<char>>(poVar2);
    return true;
  }
  std::__cxx11::string::string((string *)&local_48,(string *)binFile);
  fileToBinStr(&binStr,(Loader *)binFile,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  poVar2 = std::operator<<((ostream *)&std::cout,"Initializing FPGA...");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&local_a8,(string *)loaderFile);
  bVar1 = loadBin(this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    bVar1 = Jtag::setFreq(this->device,1500000.0);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Erasing...");
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = setIR(this,USER1);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_c8,"0",(allocator *)&local_170);
        std::__cxx11::string::string((string *)&local_e8,"",&local_172);
        std::__cxx11::string::string((string *)&local_108,"",&local_171);
        bVar1 = shiftDR(this,1,&local_c8,&local_e8,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_c8);
        if (bVar1) {
          local_170.__r = 100;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_170);
          poVar2 = std::operator<<((ostream *)&std::cout,"Writing...");
          std::endl<char,std::char_traits<char>>(poVar2);
          bVar1 = setIR(this,USER2);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_128,(string *)&binStr);
            std::__cxx11::string::string((string *)&local_148,"",(allocator *)&local_170);
            std::__cxx11::string::string((string *)&local_168,"",&local_172);
            bVar1 = shiftDR(this,(int)binStr._M_string_length << 2,&local_128,&local_148,&local_168)
            ;
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_128);
            if ((bVar1) && (bVar1 = resetState(this), bVar1)) {
              local_170.__r = 100;
              std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_170);
              poVar2 = std::operator<<((ostream *)&std::cout,"Resetting FPGA...");
              std::endl<char,std::char_traits<char>>(poVar2);
              bVar1 = setIR(this,JPROGRAM);
              std::__cxx11::string::~string((string *)&binStr);
              if (!bVar1) {
                return false;
              }
              goto LAB_00111b66;
            }
          }
        }
      }
      goto LAB_00111bd2;
    }
    pcVar3 = "Failed to set JTAG frequency!";
  }
  else {
    pcVar3 = "Failed to initialize FPGA!";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_00111bd2:
  std::__cxx11::string::~string((string *)&binStr);
  return false;
}

Assistant:

bool Loader::writeBin(string binFile, bool flash, string loaderFile) {
	if (flash) {
		string binStr = fileToBinStr(binFile);

		cout << "Initializing FPGA..." << endl;
		if (!loadBin(loaderFile)) {
			cerr << "Failed to initialize FPGA!" << endl;
			return false;
		}

		if (!device->setFreq(1500000)) {
			cerr << "Failed to set JTAG frequency!" << endl;
			return false;
		}

		cout << "Erasing..." << endl;

		// Erase the flash
		if (!setIR(USER1))
			return false;

		if (!shiftDR(1, "0", "", ""))
			return false;

		std::this_thread::sleep_for(std::chrono::milliseconds(100));

		cout << "Writing..." << endl;

		// Write the flash
		if (!setIR(USER2))
			return false;

		if (!shiftDR(binStr.length() * 4, binStr, "", ""))
			return false;

		// If you enter the reset state after a write
		// the loader firmware resets the flash into
		// regular SPI mode and gets stuck in a dead FSM
		// state. You need to do this before issuing a
		// JPROGRAM command or the FPGA can't read the
		// flash.
		if (!resetState())
			return false;

		std::this_thread::sleep_for(std::chrono::milliseconds(100)); // 100ms delay is required before issuing JPROGRAM

		cout << "Resetting FPGA..." << endl;
		// JPROGRAM resets the FPGA configuration and will
		// cause it to read the flash memory
		if (!setIR(JPROGRAM))
			return false;
	} else {
		cout << "Programming FPGA..." << endl;
		if (!loadBin(binFile)) {
			cerr << "Failed to initialize FPGA!" << endl;
			return false;
		}
	}

	// reset just for good measure
	if (!resetState())
		return false;

	cout << "Done." << endl;
	return true;
}